

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scan.cpp
# Opt level: O2

tokens __thiscall
Scanner<UTF8EncodingPolicyBase<false>_>::SkipComment
          (Scanner<UTF8EncodingPolicyBase<false>_> *this,EncodedCharPtr *pp,bool *containTypeDef)

{
  byte bVar1;
  byte *last;
  code *pcVar2;
  bool bVar3;
  OLECHAR OVar4;
  undefined4 *puVar5;
  byte *pbVar6;
  byte *local_38;
  uint ch;
  
  if (containTypeDef == (bool *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Scan.cpp"
                       ,0x5a9,"(containTypeDef != nullptr)","containTypeDef != nullptr");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar5 = 0;
  }
  local_38 = *pp;
  *containTypeDef = false;
  last = this->m_pchLast;
LAB_00d563ed:
  do {
    pbVar6 = local_38;
    local_38 = pbVar6 + 1;
    if (pbVar6 < last) {
      bVar1 = *pbVar6;
      ch = (uint)bVar1;
      if (bVar1 != 0) {
        if ((bVar1 != 10) && (bVar1 != 0xd)) {
          if (bVar1 == 0x2a) {
            if (*local_38 == 0x2f) {
              *pp = pbVar6 + 2;
              return tkNone;
            }
            goto LAB_00d563ed;
          }
          if (-1 < (char)bVar1) goto LAB_00d563ed;
          OVar4 = UTF8EncodingPolicyBase<false>::ReadRest<true>
                            (&this->super_UTF8EncodingPolicyBase<false>,(ushort)bVar1,&local_38,last
                            );
          ch = (uint)(ushort)OVar4;
          if ((OVar4 & 0xfffeU) != 0x2028) goto LAB_00d563ed;
        }
        this->m_fHadEol = 1;
        this->m_currentCharacter = local_38;
        ScanNewLine(this,ch);
        local_38 = this->m_currentCharacter;
        goto LAB_00d563ed;
      }
    }
    if (last <= local_38) {
      this->m_currentCharacter = pbVar6;
      *pp = pbVar6;
      Error(this,-0x7ff5fc08);
    }
  } while( true );
}

Assistant:

tokens Scanner<EncodingPolicy>::SkipComment(EncodedCharPtr *pp, /* out */ bool* containTypeDef)
{
    Assert(containTypeDef != nullptr);
    EncodedCharPtr p = *pp;
    *containTypeDef = false;
    EncodedCharPtr last = m_pchLast;
    OLECHAR ch;

    for (;;)
    {
        switch((ch = this->ReadFirst(p, last)))
        {
        case '*':
            if (*p == '/')
            {
                *pp = p + 1;
                return tkNone;
            }
            break;

        // ES 2015 11.3 Line Terminators
        case kchLS:         // 0x2028, classifies as new line
        case kchPS:         // 0x2029, classifies as new line
LEcmaLineBreak:
            goto LLineBreak;

        case kchRET:
        case kchNWL:
LLineBreak:
            m_fHadEol = TRUE;
            m_currentCharacter = p;
            ScanNewLine(ch);
            p = m_currentCharacter;
            break;

        case kchNUL:
            if (p >= last)
            {
                m_currentCharacter = p - 1;
                *pp = p - 1;
                Error(ERRnoCmtEnd);
            }
            break;

        default:
            if (this->IsMultiUnitChar(ch))
            {
                ch = this->template ReadRest<true>(ch, p, last);
                switch (ch)
                {
                case kchLS:
                case kchPS:
                    goto LEcmaLineBreak;
                }
            }
            break;
        }
    }
}